

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::WireType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  Type field_type;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  allocator local_19;
  
  field_type = FieldDescriptor::type((FieldDescriptor *)this);
  pcVar1 = FieldTypeName(field_type);
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_19);
  std::operator+(__return_storage_ptr__,"com.google.protobuf.WireFormat.FieldType.",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string WireType(const FieldDescriptor* field) {
  return "com.google.protobuf.WireFormat.FieldType." +
         std::string(FieldTypeName(field->type()));
}